

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O0

error_t ArgumentHandlers::perseusbelief_parse_argument(int key,char *arg,argp_state *state)

{
  long lVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  undefined4 in_EDI;
  float fVar3;
  Arguments *theArgumentsStruc;
  
  lVar1 = *(long *)(in_RDX + 0x28);
  switch(in_EDI) {
  case 0x42:
    *(undefined4 *)(lVar1 + 0x104) = 1;
    break;
  default:
    return 7;
  case 0x48:
    iVar2 = atoi(in_RSI);
    *(int *)(lVar1 + 0x108) = iVar2;
    break;
  case 0x51:
    *(undefined4 *)(lVar1 + 0x10c) = 1;
    break;
  case 0x6e:
    iVar2 = atoi(in_RSI);
    *(int *)(lVar1 + 0x100) = iVar2;
    break;
  case 0x75:
    *(undefined4 *)(lVar1 + 0xfc) = 1;
    break;
  case 0x78:
    fVar3 = strtof(in_RSI,(char **)0x0);
    *(double *)(lVar1 + 0x110) = (double)fVar3;
  }
  return 0;
}

Assistant:

error_t
perseusbelief_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case 'n':
        theArgumentsStruc->nrBeliefs = atoi(arg);
        break;
    case 'B':
        theArgumentsStruc->saveBeliefs=1;
        break;
    case 'H':
        theArgumentsStruc->resetAfter = atoi(arg);
        break;
    case 'u':
        theArgumentsStruc->uniqueBeliefs=1;
        break;
    case 'Q':
        theArgumentsStruc->useQMDPforSamplingBeliefs=1;
        break;
    case 'x':
        theArgumentsStruc->QMDPexploreProb = strtof(arg,0);
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}